

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryVkImpl.cpp
# Opt level: O3

Bool __thiscall
Diligent::DeviceMemoryVkImpl::IsCompatible(DeviceMemoryVkImpl *this,IDeviceObject *pResource)

{
  VulkanLogicalDevice *this_00;
  TextureVkImpl *pTVar1;
  BufferVkImpl *this_01;
  VkBuffer vkBuffer;
  RefCntAutoPtr<Diligent::IBufferVk> pBuffer;
  RefCntAutoPtr<Diligent::ITextureVk> pTexture;
  string msg;
  RefCntAutoPtr<Diligent::IBufferVk> local_50;
  RefCntAutoPtr<Diligent::ITextureVk> local_48;
  string local_40;
  
  this_00 = (((this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_48.m_pObject = (ITextureVk *)0x0;
  if (pResource == (IDeviceObject *)0x0) {
    local_50.m_pObject = (IBufferVk *)0x0;
LAB_001eb023:
    FormatString<char[26]>(&local_40,(char (*) [26])"unsupported resource type");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"IsCompatible",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
               ,0xae);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT44(local_40.field_2._M_allocated_capacity._4_4_,
                               local_40.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_40.field_2._M_allocated_capacity._0_4_ = 0;
  }
  else {
    (**(pResource->super_IObject)._vptr_IObject)(pResource,IID_TextureVk,&local_48);
    if (local_48.m_pObject != (ITextureVk *)0x0) {
      pTVar1 = RefCntAutoPtr<Diligent::ITextureVk>::ConstPtr<Diligent::TextureVkImpl>(&local_48);
      VulkanUtilities::VulkanLogicalDevice::GetImageMemoryRequirements
                ((VkMemoryRequirements *)&local_40,this_00,(pTVar1->m_VulkanImage).m_VkObject);
      goto LAB_001eb0c9;
    }
    local_50.m_pObject = (IBufferVk *)0x0;
    (**(pResource->super_IObject)._vptr_IObject)(pResource,IID_BufferVk);
    if (local_50.m_pObject == (IBufferVk *)0x0) goto LAB_001eb023;
    this_01 = RefCntAutoPtr<Diligent::IBufferVk>::ConstPtr<Diligent::BufferVkImpl>(&local_50);
    vkBuffer = BufferVkImpl::GetVkBuffer(this_01);
    VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
              ((VkMemoryRequirements *)&local_40,this_00,vkBuffer);
  }
  if (local_50.m_pObject != (IBufferVk *)0x0) {
    (*((local_50.m_pObject)->super_IBuffer).super_IDeviceObject.super_IObject._vptr_IObject[2])();
  }
LAB_001eb0c9:
  if (local_48.m_pObject != (ITextureVk *)0x0) {
    (*((local_48.m_pObject)->super_ITexture).super_IDeviceObject.super_IObject._vptr_IObject[2])();
  }
  return ((uint)local_40.field_2._M_allocated_capacity._0_4_ >> (this->m_MemoryTypeIndex & 0x1f) & 1
         ) != 0;
}

Assistant:

Bool DeviceMemoryVkImpl::IsCompatible(IDeviceObject* pResource) const
{
    const auto& LogicalDevice = m_pDevice->GetLogicalDevice();

    uint32_t memoryTypeBits = 0;
    if (RefCntAutoPtr<ITextureVk> pTexture{pResource, IID_TextureVk})
    {
        const auto* pTexVk = pTexture.ConstPtr<TextureVkImpl>();
        memoryTypeBits     = LogicalDevice.GetImageMemoryRequirements(pTexVk->GetVkImage()).memoryTypeBits;
    }
    else if (RefCntAutoPtr<IBufferVk> pBuffer{pResource, IID_BufferVk})
    {
        const auto* pBuffVk = pBuffer.ConstPtr<BufferVkImpl>();
        memoryTypeBits      = LogicalDevice.GetBufferMemoryRequirements(pBuffVk->GetVkBuffer()).memoryTypeBits;
    }
    else
    {
        UNEXPECTED("unsupported resource type");
    }
    return (memoryTypeBits & (1u << m_MemoryTypeIndex)) != 0;
}